

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen_c_builder.c
# Opt level: O1

int gen_union_fields(fb_output_t *out,char *st,int n,char *s,fb_compound_type_t *ct,int is_vector)

{
  byte bVar1;
  ushort uVar2;
  uint16_t uVar3;
  short sVar4;
  undefined8 *puVar5;
  fb_symbol_t *pfVar6;
  fb_compound_type_t *ct_00;
  long lVar7;
  fb_schema_t *pfVar8;
  undefined1 auVar9 [16];
  undefined4 uVar10;
  enum_entry_t *peVar11;
  uint uVar12;
  ulong extraout_RAX;
  ulong uVar13;
  entry_t *peVar14;
  entry_t *peVar15;
  entry_t *peVar16;
  dict_entry_t *__base;
  size_t sVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  undefined4 in_register_00000014;
  undefined8 uVar21;
  undefined8 *puVar22;
  long lVar23;
  fb_symbol_t *pfVar24;
  size_t sVar25;
  char *__format;
  undefined8 *puVar26;
  char *pcVar27;
  fb_output_t *out_00;
  fb_scoped_name_t *__stream;
  FILE *pFVar28;
  size_t sVar29;
  fb_scoped_name_t *sn;
  undefined8 *puVar30;
  long lVar31;
  char *pcVar32;
  fb_scoped_name_t *pfVar33;
  bool bVar34;
  uint uStack_848;
  int iStack_844;
  fb_root_schema_t *pfStack_840;
  size_t sStack_838;
  undefined1 auStack_830 [8];
  gen_match_f *pgStack_828;
  gen_unmatched_f *pgStack_820;
  fb_compound_type_t *pfStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined1 auStack_740 [24];
  object_entry_t *poStack_728;
  enum_entry_t *peStack_720;
  service_entry_t *psStack_718;
  char *pcStack_710;
  object_entry_t *poStack_708;
  enum_entry_t *peStack_700;
  service_entry_t *psStack_6f8;
  char *pcStack_6f0;
  fb_schema_t *pfStack_6e8;
  fb_scoped_name_t *pfStack_658;
  undefined8 *puStack_650;
  undefined8 uStack_648;
  fb_symbol_t *pfStack_640;
  fb_scoped_name_t *pfStack_638;
  char *pcStack_630;
  fb_scoped_name_t fStack_620;
  fb_scoped_name_t fStack_538;
  fb_output_t *pfStack_450;
  fb_scoped_name_t *pfStack_448;
  undefined8 *puStack_440;
  fb_symbol_t *pfStack_438;
  fb_scoped_name_t *pfStack_430;
  code *pcStack_428;
  fb_scoped_name_t *pfStack_420;
  fb_scoped_name_t fStack_418;
  fb_scoped_name_t fStack_330;
  ulong uStack_248;
  fb_output_t *pfStack_240;
  fb_scoped_name_t *pfStack_238;
  char *pcStack_230;
  fb_scoped_name_t *pfStack_228;
  fb_scoped_name_t *pfStack_220;
  char *local_218;
  undefined8 local_210;
  char *local_208;
  fb_scoped_name_t snref;
  fb_scoped_name_t snu;
  
  local_210 = CONCAT44(in_register_00000014,n);
  pcVar32 = "vector_value";
  if (is_vector == 0) {
    pcVar32 = "value";
  }
  pfStack_220 = (fb_scoped_name_t *)0x11074a;
  local_218 = st;
  local_208 = s;
  memset(&snref,0,0xe8);
  pfStack_220 = (fb_scoped_name_t *)0x11075e;
  memset(&snu,0,0xe8);
  out_00 = (fb_output_t *)ct->scope;
  pfStack_220 = (fb_scoped_name_t *)0x11076d;
  __flatcc_fb_scoped_symbol_name((fb_scope_t *)out_00,&ct->symbol,&snref);
  pfVar24 = ct->members;
  uVar13 = extraout_RAX;
  while( true ) {
    if (pfVar24 == (fb_symbol_t *)0x0) {
      return (int)uVar13;
    }
    uVar2 = pfVar24[1].kind;
    uVar13 = (ulong)uVar2;
    if (uVar2 != 0) break;
LAB_00110855:
    pfVar24 = pfVar24->link;
  }
  uVar13 = (ulong)(uint)pfVar24->ident->len;
  pcVar27 = pfVar24->ident->text;
  if (uVar2 == 0xb) {
    out_00 = (fb_output_t *)out->fp;
    __format = "__%sbuild_union_string_%s_field(%s, %s_%.*s, %s, %.*s)\n";
LAB_0011083a:
    pfStack_238 = &snref;
    pfStack_240 = (fb_output_t *)local_208;
    uStack_248 = local_210;
    fStack_330.total_len = 0x110851;
    fStack_330._228_4_ = 0;
    pcStack_230 = (char *)uVar13;
    pfStack_228 = (fb_scoped_name_t *)pcVar27;
    uVar12 = fprintf((FILE *)out_00,__format,out,pcVar32,out,local_218);
    uVar13 = (ulong)uVar12;
    goto LAB_00110855;
  }
  if (uVar2 == 0xf) {
    out_00 = (fb_output_t *)pfVar24[1].link[1].link;
    pfStack_220 = (fb_scoped_name_t *)0x1107b6;
    __flatcc_fb_scoped_symbol_name((fb_scope_t *)out_00,pfVar24[1].link,&snu);
    uVar3 = (pfVar24[1].link)->kind;
    if (uVar3 == 1) {
      out_00 = (fb_output_t *)out->fp;
      __format = "__%sbuild_union_struct_%s_field(%s, %s_%.*s, %s, %.*s, %s)\n";
      pfStack_220 = &snu;
    }
    else {
      if (uVar3 != 0) goto LAB_00110875;
      out_00 = (fb_output_t *)out->fp;
      __format = "__%sbuild_union_table_%s_field(%s, %s_%.*s, %s, %.*s, %s)\n";
      pfStack_220 = &snu;
    }
    goto LAB_0011083a;
  }
  pfStack_220 = (fb_scoped_name_t *)0x110875;
  gen_union_fields_cold_2();
LAB_00110875:
  pfStack_220 = (fb_scoped_name_t *)0x11087a;
  gen_union_fields_cold_1();
  pcStack_428 = (code *)0x1108b6;
  uStack_248 = uVar13;
  pfStack_240 = out;
  pfStack_238 = (fb_scoped_name_t *)pcVar32;
  pcStack_230 = pcVar27;
  pfStack_228 = &snu;
  pfStack_220 = (fb_scoped_name_t *)pfVar24;
  fprintf((FILE *)out_00->fp,"#ifndef %s_VERIFIER_H\n#define %s_VERIFIER_H\n",out_00->S->basenameup)
  ;
  pcStack_428 = (code *)0x1108d3;
  fwrite("\n/* Generated by flatcc 0.6.2 FlatBuffers schema compiler for C by dvide.com */\n\n",0x51
         ,1,(FILE *)out_00->fp);
  pcStack_428 = (code *)0x1108f6;
  fprintf((FILE *)out_00->fp,"#ifndef %s_READER_H\n",out_00->S->basenameup);
  pcStack_428 = (code *)0x110919;
  fprintf((FILE *)out_00->fp,"#include \"%s_reader.h\"\n",out_00->S->basename);
  pcStack_428 = (code *)0x110936;
  fwrite("#endif\n",7,1,(FILE *)out_00->fp);
  pcStack_428 = (code *)0x110953;
  fwrite("#include \"flatcc/flatcc_verifier.h\"\n",0x24,1,(FILE *)out_00->fp);
  pcStack_428 = (code *)0x110969;
  __flatcc_fb_gen_c_includes(out_00,"_verifier.h","_VERIFIER_H");
  if (out_00->opts->cgen_pragmas != 0) {
    pcStack_428 = (code *)0x110996;
    fwrite("#include \"flatcc/flatcc_prologue.h\"\n",0x24,1,(FILE *)out_00->fp);
  }
  pcStack_428 = (code *)0x1109a7;
  fputc(10,(FILE *)out_00->fp);
  pcStack_428 = (code *)0x1109bb;
  memset(&fStack_330,0,0xe8);
  pfVar24 = out_00->S->symbols;
  if (pfVar24 != (fb_symbol_t *)0x0) {
    do {
      if (pfVar24->kind == 0) {
        pcStack_428 = (code *)0x1109f1;
        __flatcc_fb_scoped_symbol_name((fb_scope_t *)pfVar24[1].link,pfVar24,&fStack_330);
        pcStack_428 = (code *)0x110a05;
        fprintf((FILE *)out_00->fp,
                "static int %s_verify_table(flatcc_table_verifier_descriptor_t *td);\n",&fStack_330)
        ;
      }
      pfVar24 = pfVar24->link;
    } while (pfVar24 != (fb_symbol_t *)0x0);
  }
  pcStack_428 = (code *)0x110a1e;
  fputc(10,(FILE *)out_00->fp);
  pfVar24 = out_00->S->symbols;
  if (pfVar24 != (fb_symbol_t *)0x0) {
    sn = &fStack_418;
    do {
      if (pfVar24->kind == 4) {
        pcStack_428 = (code *)0x110a5a;
        memset(&fStack_330,0,0xe8);
        pcStack_428 = (code *)0x110a69;
        memset(sn,0,0xe8);
        pcStack_428 = (code *)0x110a78;
        __flatcc_fb_scoped_symbol_name((fb_scope_t *)pfVar24[1].link,pfVar24,&fStack_330);
        __stream = (fb_scoped_name_t *)out_00->fp;
        pcStack_428 = (code *)0x110a90;
        fprintf((FILE *)__stream,
                "static int %s_union_verifier(flatcc_union_verifier_descriptor_t *ud)\n{\n    switch (ud->type) {\n"
                ,&fStack_330);
        for (puVar30 = *(undefined8 **)&pfVar24[1].kind; puVar30 != (undefined8 *)0x0;
            puVar30 = (undefined8 *)*puVar30) {
          sVar4 = *(short *)(puVar30 + 5);
          if (sVar4 != 0) {
            uVar12 = *(uint *)((undefined8 *)puVar30[1] + 1);
            pcVar32 = (char *)(ulong)uVar12;
            pfVar33 = *(fb_scoped_name_t **)puVar30[1];
            if (sVar4 == 0xb) {
              __stream = (fb_scoped_name_t *)out_00->fp;
              pcStack_428 = (code *)0x110b29;
              fprintf((FILE *)__stream,
                      "    case %u: return flatcc_verify_union_string(ud); /* %.*s */\n",
                      (ulong)*(uint *)(puVar30 + 9),pcVar32);
            }
            else {
              if (sVar4 != 0xf) {
                pcStack_428 = (code *)0x111229;
                __flatcc_fb_gen_c_verifier_cold_2();
LAB_00111229:
                pcStack_428 = (code *)0x11122e;
                __flatcc_fb_gen_c_verifier_cold_1();
                goto switchD_00110ed8_caseD_2;
              }
              __stream = (fb_scoped_name_t *)((fb_symbol_t *)puVar30[3])[1].link;
              pcStack_428 = (code *)0x110ad2;
              __flatcc_fb_scoped_symbol_name((fb_scope_t *)__stream,(fb_symbol_t *)puVar30[3],sn);
              lVar31 = puVar30[3];
              if (*(short *)(lVar31 + 0x10) == 1) {
                __stream = (fb_scoped_name_t *)out_00->fp;
                pcStack_428 = (code *)0x110b5a;
                pfStack_420 = pfVar33;
                fprintf((FILE *)__stream,
                        "    case %u: return flatcc_verify_union_struct(ud, %lu, %u); /* %.*s */\n",
                        (ulong)*(uint *)(puVar30 + 9),*(undefined8 *)(lVar31 + 0xc0),
                        (ulong)*(ushort *)(lVar31 + 0xb8),pcVar32);
              }
              else {
                if (*(short *)(lVar31 + 0x10) != 0) goto LAB_00111229;
                __stream = (fb_scoped_name_t *)out_00->fp;
                pcStack_428 = (code *)0x110b09;
                fprintf((FILE *)__stream,
                        "    case %u: return flatcc_verify_union_table(ud, %s_verify_table); /* %.*s */\n"
                        ,(ulong)*(uint *)(puVar30 + 9),sn,(ulong)uVar12,pfVar33);
              }
            }
          }
        }
        pcStack_428 = (code *)0x110b80;
        fwrite("    default: return flatcc_verify_ok;\n    }\n}\n\n",0x2f,1,(FILE *)out_00->fp);
      }
      pfVar24 = pfVar24->link;
    } while (pfVar24 != (fb_symbol_t *)0x0);
  }
  pfVar24 = out_00->S->symbols;
  if (pfVar24 != (fb_symbol_t *)0x0) {
    do {
      if (pfVar24->kind == 1) {
        pcStack_428 = (code *)0x110bd8;
        memset(&fStack_330,0,0xe8);
        pcStack_428 = (code *)0x110be7;
        __flatcc_fb_scoped_symbol_name((fb_scope_t *)pfVar24[1].link,pfVar24,&fStack_330);
        pcStack_428 = (code *)0x110c11;
        fprintf((FILE *)out_00->fp,
                "static inline int %s_verify_as_root(const void *buf, size_t bufsiz)\n{\n    return flatcc_verify_struct_as_root(buf, bufsiz, %s_identifier, %lu, %u);\n}\n\n"
                ,&fStack_330,&fStack_330,pfVar24[8].link,(ulong)pfVar24[7].kind);
        pcStack_428 = (code *)0x110c3b;
        fprintf((FILE *)out_00->fp,
                "static inline int %s_verify_as_root_with_size(const void *buf, size_t bufsiz)\n{\n    return flatcc_verify_struct_as_root_with_size(buf, bufsiz, %s_identifier, %lu, %u);\n}\n\n"
                ,&fStack_330,&fStack_330,pfVar24[8].link,(ulong)pfVar24[7].kind);
        pcStack_428 = (code *)0x110c65;
        fprintf((FILE *)out_00->fp,
                "static inline int %s_verify_as_typed_root(const void *buf, size_t bufsiz)\n{\n    return flatcc_verify_struct_as_typed_root(buf, bufsiz, %s_type_hash, %lu, %u);\n}\n\n"
                ,&fStack_330,&fStack_330,pfVar24[8].link,(ulong)pfVar24[7].kind);
        pcStack_428 = (code *)0x110c8f;
        fprintf((FILE *)out_00->fp,
                "static inline int %s_verify_as_typed_root_with_size(const void *buf, size_t bufsiz)\n{\n    return flatcc_verify_struct_as_typed_root_with_size(buf, bufsiz, %s_type_hash, %lu, %u);\n}\n\n"
                ,&fStack_330,&fStack_330,pfVar24[8].link,(ulong)pfVar24[7].kind);
        pcStack_428 = (code *)0x110cb9;
        fprintf((FILE *)out_00->fp,
                "static inline int %s_verify_as_root_with_type_hash(const void *buf, size_t bufsiz, %sthash_t thash)\n{\n    return flatcc_verify_struct_as_typed_root(buf, bufsiz, thash, %lu, %u);\n}\n\n"
                ,&fStack_330,out_00,pfVar24[8].link,(ulong)pfVar24[7].kind);
        pcStack_428 = (code *)0x110cdf;
        fprintf((FILE *)out_00->fp,
                "static inline int %s_verify_as_root_with_type_hash_and_size(const void *buf, size_t bufsiz, %sthash_t thash)\n{\n    return flatcc_verify_struct_as_typed_root_with_size(buf, bufsiz, thash, %lu, %u);\n}\n\n"
                ,&fStack_330,out_00,pfVar24[8].link,(ulong)pfVar24[7].kind);
        pcStack_428 = (code *)0x110d02;
        fprintf((FILE *)out_00->fp,
                "static inline int %s_verify_as_root_with_identifier(const void *buf, size_t bufsiz, const char *fid)\n{\n    return flatcc_verify_struct_as_root(buf, bufsiz, fid, %lu, %u);\n}\n\n"
                ,&fStack_330,pfVar24[8].link,(ulong)pfVar24[7].kind);
        pcStack_428 = (code *)0x110d25;
        fprintf((FILE *)out_00->fp,
                "static inline int %s_verify_as_root_with_identifier_and_size(const void *buf, size_t bufsiz, const char *fid)\n{\n    return flatcc_verify_struct_as_root_with_size(buf, bufsiz, fid, %lu, %u);\n}\n\n"
                ,&fStack_330,pfVar24[8].link);
      }
      pfVar24 = pfVar24->link;
    } while (pfVar24 != (fb_symbol_t *)0x0);
  }
  pfVar24 = out_00->S->symbols;
  if (pfVar24 == (fb_symbol_t *)0x0) goto LAB_001111c0;
  pcVar32 = ")) return ret;\n    if ((ret = ";
LAB_00110d59:
  if (pfVar24->kind != 0) goto LAB_001111b4;
  pcStack_428 = (code *)0x110d74;
  memset(&fStack_330,0,0xe8);
  pcStack_428 = (code *)0x110d83;
  memset(&fStack_418,0,0xe8);
  pcStack_428 = (code *)0x110d92;
  __flatcc_fb_scoped_symbol_name((fb_scope_t *)pfVar24[1].link,pfVar24,&fStack_330);
  pcStack_428 = (code *)0x110daa;
  fprintf((FILE *)out_00->fp,
          "static int %s_verify_table(flatcc_table_verifier_descriptor_t *td)\n{\n",&fStack_330);
  puVar30 = *(undefined8 **)&pfVar24[1].kind;
  if (puVar30 == (undefined8 *)0x0) goto LAB_00111090;
  bVar34 = true;
LAB_00110dbd:
  pfVar33 = &fStack_330;
  if ((*(byte *)(puVar30 + 0xe) & 4) != 0) goto LAB_0011105c;
  if (bVar34) {
    sVar29 = 0x1c;
    pcVar27 = "    int ret;\n    if ((ret = ";
  }
  else {
    sVar29 = 0x1e;
    pcVar27 = pcVar32;
  }
  pcStack_428 = (code *)0x110df9;
  fwrite(pcVar27,sVar29,1,(FILE *)out_00->fp);
  if (8 < *(ushort *)(puVar30 + 5) - 8) goto switchD_00110e24_caseD_c;
  sn = (fb_scoped_name_t *)(ulong)(*(uint *)(puVar30 + 0xe) >> 8 & 1);
  switch((uint)*(ushort *)(puVar30 + 5)) {
  case 8:
    pfVar6 = (fb_symbol_t *)puVar30[0x12];
    if (pfVar6 == (fb_symbol_t *)0x0) {
switchD_00110ed8_caseD_1:
      lVar31 = puVar30[0x10];
      auVar9._8_8_ = 0;
      auVar9._0_8_ = lVar31 + (ulong)(lVar31 == 0);
      pfStack_420 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffff)) / auVar9,0);
      pcStack_428 = (code *)0x110f21;
      fprintf((FILE *)out_00->fp,"flatcc_verify_vector_field(td, %lu, %d, %lu, %u, INT64_C(%lu))",
              puVar30[0x11],sn,lVar31,(ulong)*(ushort *)((long)puVar30 + 0x72));
    }
    else {
      pcStack_428 = (code *)0x110e4a;
      __flatcc_fb_scoped_symbol_name((fb_scope_t *)pfVar6[1].link,pfVar6,&fStack_418);
      if (*(short *)(puVar30[0x12] + 0x10) == 0) {
        pcStack_428 = (code *)0x11102f;
        fprintf((FILE *)out_00->fp,
                "flatcc_verify_table_as_nested_root(td, %lu, %u, 0, %u, %s_verify_table)",
                puVar30[0x11],sn,(ulong)*(ushort *)((long)puVar30 + 0x72),&fStack_418);
      }
      else {
        pcStack_428 = (code *)0x110e87;
        fprintf((FILE *)out_00->fp,"flatcc_verify_struct_as_nested_root(td, %lu, %u, 0, %lu,  %u)",
                puVar30[0x11],sn,puVar30[0x10],(ulong)*(ushort *)((long)puVar30 + 0x72));
      }
    }
    break;
  case 9:
switchD_00110e24_caseD_9:
    pcStack_428 = (code *)0x110fa6;
    fprintf((FILE *)out_00->fp,"flatcc_verify_field(td, %lu, %lu, %u)",puVar30[0x11],puVar30[0x10]);
    break;
  case 10:
    pFVar28 = (FILE *)out_00->fp;
    uVar21 = puVar30[0x11];
    pcVar27 = "flatcc_verify_string_vector_field(td, %lu, %d)";
    goto LAB_00110f3b;
  case 0xb:
    pFVar28 = (FILE *)out_00->fp;
    uVar21 = puVar30[0x11];
    pcVar27 = "flatcc_verify_string_field(td, %lu, %d)";
LAB_00110f3b:
    pcStack_428 = (code *)0x110f45;
    fprintf(pFVar28,pcVar27,uVar21,sn);
    break;
  case 0xf:
    __stream = (fb_scoped_name_t *)((fb_symbol_t *)puVar30[3])[1].link;
    pcStack_428 = (code *)0x110f5c;
    __flatcc_fb_scoped_symbol_name((fb_scope_t *)__stream,(fb_symbol_t *)puVar30[3],&fStack_418);
    switch(*(undefined2 *)(puVar30[3] + 0x10)) {
    case 0:
      pFVar28 = (FILE *)out_00->fp;
      uVar21 = puVar30[0x11];
      pcVar27 = "flatcc_verify_table_field(td, %lu, %d, &%s_verify_table)";
      break;
    case 1:
    case 3:
      goto switchD_00110e24_caseD_9;
    default:
      goto switchD_00110f7c_caseD_2;
    case 4:
      pFVar28 = (FILE *)out_00->fp;
      uVar21 = puVar30[0x11];
      pcVar27 = "flatcc_verify_union_field(td, %lu, %d, &%s_union_verifier)";
    }
    goto LAB_00111005;
  case 0x10:
    __stream = (fb_scoped_name_t *)((fb_symbol_t *)puVar30[3])[1].link;
    pcStack_428 = (code *)0x110eb8;
    __flatcc_fb_scoped_symbol_name((fb_scope_t *)__stream,(fb_symbol_t *)puVar30[3],&fStack_418);
    switch(*(undefined2 *)(puVar30[3] + 0x10)) {
    case 0:
      pFVar28 = (FILE *)out_00->fp;
      uVar21 = puVar30[0x11];
      pcVar27 = "flatcc_verify_table_vector_field(td, %lu, %d, &%s_verify_table)";
      break;
    case 1:
    case 3:
      goto switchD_00110ed8_caseD_1;
    default:
      goto switchD_00110ed8_caseD_2;
    case 4:
      pFVar28 = (FILE *)out_00->fp;
      uVar21 = puVar30[0x11];
      pcVar27 = "flatcc_verify_union_vector_field(td, %lu, %d, &%s_union_verifier)";
    }
LAB_00111005:
    pcStack_428 = (code *)0x111014;
    fprintf(pFVar28,pcVar27,uVar21,sn);
  }
switchD_00110e24_caseD_c:
  bVar34 = false;
  pcStack_428 = (code *)0x11105c;
  fprintf((FILE *)out_00->fp," /* %.*s */",(ulong)*(uint *)((undefined8 *)puVar30[1] + 1),
          *(undefined8 *)puVar30[1]);
LAB_0011105c:
  puVar30 = (undefined8 *)*puVar30;
  if (puVar30 == (undefined8 *)0x0) goto code_r0x00111069;
  goto LAB_00110dbd;
code_r0x00111069:
  if (!bVar34) {
    pcStack_428 = (code *)0x111090;
    fwrite(")) return ret;\n",0xf,1,(FILE *)out_00->fp);
  }
LAB_00111090:
  pcStack_428 = (code *)0x1110ad;
  fwrite("    return flatcc_verify_ok;\n",0x1d,1,(FILE *)out_00->fp);
  pcStack_428 = (code *)0x1110ca;
  fwrite("}\n\n",3,1,(FILE *)out_00->fp);
  pcStack_428 = (code *)0x1110e8;
  fprintf((FILE *)out_00->fp,
          "static inline int %s_verify_as_root(const void *buf, size_t bufsiz)\n{\n    return flatcc_verify_table_as_root(buf, bufsiz, %s_identifier, &%s_verify_table);\n}\n\n"
          ,&fStack_330,&fStack_330,&fStack_330);
  pcStack_428 = (code *)0x111106;
  fprintf((FILE *)out_00->fp,
          "static inline int %s_verify_as_root_with_size(const void *buf, size_t bufsiz)\n{\n    return flatcc_verify_table_as_root_with_size(buf, bufsiz, %s_identifier, &%s_verify_table);\n}\n\n"
          ,&fStack_330,&fStack_330,&fStack_330);
  pcStack_428 = (code *)0x111124;
  fprintf((FILE *)out_00->fp,
          "static inline int %s_verify_as_typed_root(const void *buf, size_t bufsiz)\n{\n    return flatcc_verify_table_as_root(buf, bufsiz, %s_type_identifier, &%s_verify_table);\n}\n\n"
          ,&fStack_330,&fStack_330,&fStack_330);
  pcStack_428 = (code *)0x111142;
  fprintf((FILE *)out_00->fp,
          "static inline int %s_verify_as_typed_root_with_size(const void *buf, size_t bufsiz)\n{\n    return flatcc_verify_table_as_root_with_size(buf, bufsiz, %s_type_identifier, &%s_verify_table);\n}\n\n"
          ,&fStack_330,&fStack_330,&fStack_330);
  pcStack_428 = (code *)0x11115d;
  fprintf((FILE *)out_00->fp,
          "static inline int %s_verify_as_root_with_identifier(const void *buf, size_t bufsiz, const char *fid)\n{\n    return flatcc_verify_table_as_root(buf, bufsiz, fid, &%s_verify_table);\n}\n\n"
          ,&fStack_330,&fStack_330);
  pcStack_428 = (code *)0x111178;
  fprintf((FILE *)out_00->fp,
          "static inline int %s_verify_as_root_with_identifier_and_size(const void *buf, size_t bufsiz, const char *fid)\n{\n    return flatcc_verify_table_as_root_with_size(buf, bufsiz, fid, &%s_verify_table);\n}\n\n"
          ,&fStack_330,&fStack_330);
  pcStack_428 = (code *)0x111196;
  fprintf((FILE *)out_00->fp,
          "static inline int %s_verify_as_root_with_type_hash(const void *buf, size_t bufsiz, %sthash_t thash)\n{\n    return flatcc_verify_table_as_typed_root(buf, bufsiz, thash, &%s_verify_table);\n}\n\n"
          ,&fStack_330,out_00,&fStack_330);
  pcStack_428 = (code *)0x1111b4;
  fprintf((FILE *)out_00->fp,
          "static inline int %s_verify_as_root_with_type_hash_and_size(const void *buf, size_t bufsiz, %sthash_t thash)\n{\n    return flatcc_verify_table_as_typed_root_with_size(buf, bufsiz, thash, &%s_verify_table);\n}\n\n"
          ,&fStack_330,out_00);
LAB_001111b4:
  pfVar24 = pfVar24->link;
  if (pfVar24 == (fb_symbol_t *)0x0) {
LAB_001111c0:
    if (out_00->opts->cgen_pragmas != 0) {
      pcStack_428 = (code *)0x1111ed;
      fwrite("#include \"flatcc/flatcc_epilogue.h\"\n",0x24,1,(FILE *)out_00->fp);
    }
    pcStack_428 = (code *)0x111210;
    fprintf((FILE *)out_00->fp,"#endif /* %s_VERIFIER_H */\n",out_00->S->basenameup);
    return 0;
  }
  goto LAB_00110d59;
switchD_00110ed8_caseD_2:
  pcStack_428 = (code *)0x111233;
  __flatcc_fb_gen_c_verifier_cold_3();
switchD_00110f7c_caseD_2:
  pcStack_428 = __flatcc_fb_gen_c_sorter;
  __flatcc_fb_gen_c_verifier_cold_4();
  lVar31 = *(long *)&__stream->scope_len;
  puVar5 = *(undefined8 **)(lVar31 + 0x40);
  for (puVar26 = puVar5; puVar26 != (undefined8 *)0x0; puVar26 = (undefined8 *)*puVar26) {
    if ((*(ushort *)(puVar26 + 2) & 0xfffb) == 0) {
      for (puVar22 = (undefined8 *)puVar26[5]; puVar22 != (undefined8 *)0x0;
          puVar22 = (undefined8 *)*puVar22) {
        if ((ushort)((short)*(undefined4 *)(puVar22 + 5) - 0xfU) < 2) {
          *(undefined8 *)(puVar22[3] + 0xd0) = 0;
        }
      }
      puVar26[0x1a] = 0;
    }
  }
  iVar18 = 0;
  do {
    iVar20 = 0;
    if (puVar5 != (undefined8 *)0x0) {
      iVar20 = 0;
      puVar26 = puVar5;
      do {
        if ((*(ushort *)(puVar26 + 2) & 0xfffb) == 0) {
          for (puVar22 = (undefined8 *)puVar26[5]; puVar22 != (undefined8 *)0x0;
              puVar22 = (undefined8 *)*puVar22) {
            if ((*(ushort *)(puVar22 + 0xe) & 4) == 0) {
              if ((*(ushort *)(puVar22 + 0xe) >> 0xd & 1) != 0) {
                *(byte *)(puVar26 + 0x1a) = *(byte *)(puVar26 + 0x1a) | 1;
              }
              if ((((*(short *)(puVar22 + 5) == 0x10) || (*(short *)(puVar22 + 5) == 0xf)) &&
                  ((*(ushort *)(puVar22[3] + 0x10) & 0xfffb) == 0)) &&
                 ((*(byte *)(puVar22[3] + 0xd0) & 3) != 0)) {
                *(byte *)(puVar26 + 0x1a) = *(byte *)(puVar26 + 0x1a) | 1;
              }
            }
          }
          iVar20 = (iVar20 + 1) - (uint)((*(byte *)(puVar26 + 0x1a) & 3) == 0);
        }
        puVar26 = (undefined8 *)*puVar26;
      } while (puVar26 != (undefined8 *)0x0);
    }
    bVar34 = iVar18 != iVar20;
    iVar18 = iVar20;
  } while (bVar34);
  pcStack_630 = (char *)0x111363;
  pfStack_450 = out_00;
  pfStack_448 = sn;
  puStack_440 = puVar30;
  pfStack_438 = pfVar24;
  pfStack_430 = pfVar33;
  pcStack_428 = (code *)pcVar32;
  memset(&fStack_538,0,0xe8);
  pfVar24 = *(fb_symbol_t **)(lVar31 + 0x40);
  if (pfVar24 != (fb_symbol_t *)0x0) {
    do {
      if ((pfVar24->kind == 0) && ((pfVar24[8].kind & 3) != 0)) {
        pcStack_630 = (char *)0x11139c;
        __flatcc_fb_scoped_symbol_name((fb_scope_t *)pfVar24[1].link,pfVar24,&fStack_538);
        pcStack_630 = (char *)0x1113b3;
        fprintf((FILE *)__stream->scope,"static void %s_sort(%s_mutable_table_t t);\n",&fStack_538,
                &fStack_538);
      }
      pfVar24 = pfVar24->link;
    } while (pfVar24 != (fb_symbol_t *)0x0);
  }
  pcStack_630 = (char *)0x1113cc;
  fputc(10,(FILE *)__stream->scope);
  pfVar24 = *(fb_symbol_t **)(*(long *)&__stream->scope_len + 0x40);
  if (pfVar24 != (fb_symbol_t *)0x0) {
    do {
      if ((pfVar24->kind == 4) && ((pfVar24[8].kind & 3) != 0)) {
        pcStack_630 = (char *)0x111416;
        memset(&fStack_538,0,0xe8);
        pcStack_630 = (char *)0x111425;
        memset(&fStack_620,0,0xe8);
        pcStack_630 = (char *)0x111434;
        __flatcc_fb_scoped_symbol_name((fb_scope_t *)pfVar24[1].link,pfVar24,&fStack_538);
        pcStack_630 = (char *)0x11144f;
        fprintf((FILE *)__stream->scope,
                "static void %s_sort(%s_mutable_union_t u)\n{\n    switch (u.type) {\n",&fStack_538,
                &fStack_538);
        for (puVar30 = *(undefined8 **)&pfVar24[1].kind; puVar30 != (undefined8 *)0x0;
            puVar30 = (undefined8 *)*puVar30) {
          if (*(short *)(puVar30 + 5) == 0xf) {
            uVar12 = *(uint *)((undefined8 *)puVar30[1] + 1);
            uVar21 = *(undefined8 *)puVar30[1];
            pcStack_630 = (char *)0x11147a;
            __flatcc_fb_scoped_symbol_name
                      ((fb_scope_t *)((fb_symbol_t *)puVar30[3])[1].link,(fb_symbol_t *)puVar30[3],
                       &fStack_620);
            if ((*(short *)(puVar30[3] + 0x10) == 0) && ((*(byte *)(puVar30[3] + 0xd0) & 3) != 0)) {
              pcStack_630 = (char *)0x1114b3;
              fprintf((FILE *)__stream->scope,"    case %s_%.*s: %s_sort(u.value); break;\n",
                      &fStack_538,(ulong)uVar12,uVar21,&fStack_620);
            }
          }
        }
        pcStack_630 = (char *)0x1114d5;
        fwrite("    default: break;\n    }\n}\n\n",0x1d,1,(FILE *)__stream->scope);
      }
      pfVar24 = pfVar24->link;
    } while (pfVar24 != (fb_symbol_t *)0x0);
  }
  pfVar24 = *(fb_symbol_t **)(*(long *)&__stream->scope_len + 0x40);
  if (pfVar24 != (fb_symbol_t *)0x0) {
    do {
      if ((pfVar24->kind == 0) && ((pfVar24[8].kind & 3) != 0)) {
        pcStack_630 = (char *)0x111526;
        memset(&fStack_538,0,0xe8);
        pcStack_630 = (char *)0x111537;
        memset(&fStack_620,0,0xe8);
        pcStack_630 = (char *)0x111546;
        __flatcc_fb_scoped_symbol_name((fb_scope_t *)pfVar24[1].link,pfVar24,&fStack_538);
        pcStack_630 = (char *)0x111561;
        fprintf((FILE *)__stream->scope,"static void %s_sort(%s_mutable_table_t t)\n{\n",&fStack_538
                ,&fStack_538);
        pcVar32 = "    if (!t) return;\n";
        pcStack_630 = (char *)0x11157e;
        fwrite("    if (!t) return;\n",0x14,1,(FILE *)__stream->scope);
        if ((pfVar24[8].kind & 1) != 0) {
          for (puVar30 = *(undefined8 **)&pfVar24[1].kind; puVar30 != (undefined8 *)0x0;
              puVar30 = (undefined8 *)*puVar30) {
            if ((*(byte *)(puVar30 + 0xe) & 4) == 0) {
              uVar12 = *(uint *)((undefined8 *)puVar30[1] + 1);
              uVar21 = *(undefined8 *)puVar30[1];
              if (*(short *)(puVar30 + 5) == 0x10) {
                pcVar32 = (char *)((fb_symbol_t *)puVar30[3])[1].link;
                pcStack_630 = (char *)0x111643;
                __flatcc_fb_scoped_symbol_name
                          ((fb_scope_t *)pcVar32,(fb_symbol_t *)puVar30[3],&fStack_620);
                lVar31 = puVar30[3];
                if (*(short *)(lVar31 + 0x10) == 4) {
                  bVar1 = *(byte *)(lVar31 + 0xd0);
                  pcVar27 = "    __%ssort_union_vector_field_elements(%s, %.*s, %s, t);\n";
                }
                else {
                  if (*(short *)(lVar31 + 0x10) != 0) goto LAB_0011168e;
                  bVar1 = *(byte *)(lVar31 + 0xd0);
                  pcVar27 = "    __%ssort_table_vector_field_elements(%s, %.*s, %s, t);\n";
                }
              }
              else {
                if (*(short *)(puVar30 + 5) != 0xf) goto LAB_0011168e;
                pcVar32 = (char *)((fb_symbol_t *)puVar30[3])[1].link;
                pcStack_630 = (char *)0x11160c;
                __flatcc_fb_scoped_symbol_name
                          ((fb_scope_t *)pcVar32,(fb_symbol_t *)puVar30[3],&fStack_620);
                lVar31 = puVar30[3];
                if (*(short *)(lVar31 + 0x10) == 4) {
                  bVar1 = *(byte *)(lVar31 + 0xd0);
                  pcVar27 = "    __%ssort_union_field(%s, %.*s, %s, t);\n";
                }
                else {
                  if (*(short *)(lVar31 + 0x10) != 0) goto LAB_0011168e;
                  bVar1 = *(byte *)(lVar31 + 0xd0);
                  pcVar27 = "    __%ssort_table_field(%s, %.*s, %s, t);\n";
                }
              }
              if ((bVar1 & 3) != 0) {
                pcVar32 = (char *)__stream->scope;
                pfStack_638 = &fStack_620;
                pfStack_640 = (fb_symbol_t *)0x11168a;
                fprintf((FILE *)pcVar32,pcVar27,__stream,&fStack_538,(ulong)uVar12,uVar21);
              }
            }
LAB_0011168e:
          }
        }
        if ((pfVar24[8].kind & 1) != 0) {
          for (puVar30 = *(undefined8 **)&pfVar24[1].kind; puVar30 != (undefined8 *)0x0;
              puVar30 = (undefined8 *)*puVar30) {
            if ((*(byte *)((long)puVar30 + 0x71) & 0x20) != 0) {
              uVar12 = *(uint *)((undefined8 *)puVar30[1] + 1);
              uVar21 = *(undefined8 *)puVar30[1];
              sVar4 = *(short *)(puVar30 + 5);
              if (sVar4 == 0x10) {
                pfVar6 = (fb_symbol_t *)puVar30[3];
                if (pfVar6[2].ident == (fb_token_t *)0x0) {
LAB_001117d6:
                  pcStack_630 = (char *)0x1117db;
                  __flatcc_fb_gen_c_sorter_cold_1();
                  pfStack_658 = __stream;
                  puStack_650 = puVar30;
                  uStack_648 = uVar21;
                  pfStack_640 = pfVar24;
                  pfStack_638 = &fStack_538;
                  pcStack_630 = (char *)(ulong)uVar12;
                  println((fb_output_t *)pcVar32,"#ifndef %s_JSON_PARSER_H",
                          ((fb_output_t *)pcVar32)->S->basenameup);
                  println((fb_output_t *)pcVar32,"#define %s_JSON_PARSER_H",
                          ((fb_output_t *)pcVar32)->S->basenameup);
                  println((fb_output_t *)pcVar32,"");
                  println((fb_output_t *)pcVar32,
                          "/* Generated by flatcc 0.6.2 FlatBuffers schema compiler for C by dvide.com */"
                         );
                  println((fb_output_t *)pcVar32,"");
                  println((fb_output_t *)pcVar32,"#include \"flatcc/flatcc_json_parser.h\"");
                  __flatcc_fb_gen_c_includes
                            ((fb_output_t *)pcVar32,"_json_parser.h","_JSON_PARSER_H");
                  if (((fb_output_t *)pcVar32)->opts->cgen_pragmas != 0) {
                    fwrite("#include \"flatcc/flatcc_prologue.h\"\n",0x24,1,
                           (FILE *)((fb_output_t *)pcVar32)->fp);
                  }
                  println((fb_output_t *)pcVar32,"");
                  pfVar24 = (((fb_output_t *)pcVar32)->S->root_type).type;
                  memset(auStack_740,0,0xe8);
                  if ((pfVar24 != (fb_symbol_t *)0x0) && (pfVar24->kind < 2)) {
                    println((fb_output_t *)pcVar32,"/*");
                    println((fb_output_t *)pcVar32,
                            " * Parses the default root table or struct of the schema and constructs a FlatBuffer."
                           );
                    println((fb_output_t *)pcVar32," *");
                    println((fb_output_t *)pcVar32,
                            " * Builder `B` must be initialized. `ctx` can be null but will hold");
                    println((fb_output_t *)pcVar32,
                            " * hold detailed error info on return when available.");
                    println((fb_output_t *)pcVar32," * Returns 0 on success, or error code.");
                    println((fb_output_t *)pcVar32,
                            " * `flags` : 0 by default, `flatcc_json_parser_f_skip_unknown` silently"
                           );
                    println((fb_output_t *)pcVar32,
                            " * ignores unknown table and structs fields, and union types.");
                    println((fb_output_t *)pcVar32," */");
                    println((fb_output_t *)pcVar32,
                            "static int %s_parse_json(flatcc_builder_t *B, flatcc_json_parser_t *ctx,"
                            ,((fb_output_t *)pcVar32)->S->basename);
                    ((fb_output_t *)pcVar32)->indent = ((fb_output_t *)pcVar32)->indent + 2;
                    println((fb_output_t *)pcVar32,
                            "const char *buf, size_t bufsiz, flatcc_json_parser_flags_t flags);");
                    iVar18 = ((fb_output_t *)pcVar32)->indent;
                    if ((iVar18 == 0) ||
                       (((fb_output_t *)pcVar32)->indent = iVar18 + -1, iVar18 + -1 == 0)) {
                      __assert_fail("out->indent",
                                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                                    ,0x6e9,"int gen_json_parser_prototypes(fb_output_t *)");
                    }
                    ((fb_output_t *)pcVar32)->indent = iVar18 + -2;
                    println((fb_output_t *)pcVar32,"");
                  }
                  pfVar24 = ((fb_output_t *)pcVar32)->S->symbols;
                  if (pfVar24 == (fb_symbol_t *)0x0) goto LAB_00111b89;
                  goto LAB_00111a2f;
                }
                pcVar32 = (char *)pfVar6[1].link;
                pcStack_630 = (char *)0x111788;
                __flatcc_fb_scoped_symbol_name((fb_scope_t *)pcVar32,pfVar6,&fStack_620);
                if (1 < *(ushort *)(puVar30[3] + 0x10)) goto LAB_00111765;
                pcVar32 = (char *)__stream->scope;
                pcVar27 = "    __%ssort_vector_field(%s, %.*s, %s, t)\n";
                pfStack_638 = &fStack_620;
              }
              else {
                if (sVar4 == 10) {
                  pcVar32 = (char *)__stream->scope;
                  pcStack_630 = "string";
                }
                else {
                  if (sVar4 != 8) goto LAB_00111765;
                  if (0xb < *(int *)(puVar30 + 3) - 1U) {
                    pcStack_630 = (char *)0x1117d6;
                    __flatcc_fb_gen_c_sorter_cold_2();
                    goto LAB_001117d6;
                  }
                  pcStack_630 = &DAT_00141888 +
                                *(int *)(&DAT_00141888 + (ulong)(*(int *)(puVar30 + 3) - 1U) * 4);
                  pcVar32 = (char *)__stream->scope;
                }
                pcVar27 = "    __%ssort_vector_field(%s, %.*s, %s%s, t)\n";
                pfStack_638 = __stream;
              }
              pfStack_640 = (fb_symbol_t *)0x111761;
              fprintf((FILE *)pcVar32,pcVar27,__stream,&fStack_538,(ulong)uVar12,uVar21);
            }
LAB_00111765:
          }
        }
        pcStack_630 = (char *)0x1115b3;
        fwrite("}\n\n",3,1,(FILE *)__stream->scope);
      }
      pfVar24 = pfVar24->link;
    } while (pfVar24 != (fb_symbol_t *)0x0);
  }
  return 0;
LAB_00111a2f:
  do {
    switch(pfVar24->kind) {
    case 0:
      __flatcc_fb_scoped_symbol_name
                ((fb_scope_t *)pfVar24[1].link,pfVar24,(fb_scoped_name_t *)auStack_740);
      pcVar27 = 
      "static const char *%s_parse_json_table(flatcc_json_parser_t *ctx, const char *buf, const char *end, flatcc_builder_ref_t *result);"
      ;
      break;
    case 1:
      __flatcc_fb_scoped_symbol_name
                ((fb_scope_t *)pfVar24[1].link,pfVar24,(fb_scoped_name_t *)auStack_740);
      println((fb_output_t *)pcVar32,
              "static const char *%s_parse_json_struct_inline(flatcc_json_parser_t *ctx, const char *buf, const char *end, void *struct_base);"
              ,(fb_scoped_name_t *)auStack_740);
      pcVar27 = 
      "static const char *%s_parse_json_struct(flatcc_json_parser_t *ctx, const char *buf, const char *end, flatcc_builder_ref_t *result);"
      ;
      break;
    default:
      goto switchD_00111a46_caseD_2;
    case 3:
      __flatcc_fb_scoped_symbol_name
                ((fb_scope_t *)pfVar24[1].link,pfVar24,(fb_scoped_name_t *)auStack_740);
      println((fb_output_t *)pcVar32,
              "static const char *%s_parse_json_enum(flatcc_json_parser_t *ctx, const char *buf, const char *end,"
              ,(fb_scoped_name_t *)auStack_740);
      ((fb_output_t *)pcVar32)->indent = ((fb_output_t *)pcVar32)->indent + 2;
      println((fb_output_t *)pcVar32,"int *value_type, uint64_t *value, int *aggregate);",
              (fb_scoped_name_t *)auStack_740);
      iVar18 = ((fb_output_t *)pcVar32)->indent;
      if ((iVar18 == 0) || (((fb_output_t *)pcVar32)->indent = iVar18 + -1, iVar18 + -1 == 0)) {
LAB_001132ec:
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x709,"int gen_json_parser_prototypes(fb_output_t *)");
      }
      goto LAB_00111b74;
    case 4:
      __flatcc_fb_scoped_symbol_name
                ((fb_scope_t *)pfVar24[1].link,pfVar24,(fb_scoped_name_t *)auStack_740);
      println((fb_output_t *)pcVar32,
              "static const char *%s_parse_json_union(flatcc_json_parser_t *ctx, const char *buf, const char *end, uint8_t type, flatcc_builder_ref_t *pref);"
              ,(fb_scoped_name_t *)auStack_740);
      println((fb_output_t *)pcVar32,"static int %s_json_union_accept_type(uint8_t type);",
              (fb_scoped_name_t *)auStack_740);
      println((fb_output_t *)pcVar32,
              "static const char *%s_parse_json_enum(flatcc_json_parser_t *ctx, const char *buf, const char *end,"
              ,(fb_scoped_name_t *)auStack_740);
      ((fb_output_t *)pcVar32)->indent = ((fb_output_t *)pcVar32)->indent + 2;
      println((fb_output_t *)pcVar32,"int *value_type, uint64_t *value, int *aggregate);");
      iVar18 = ((fb_output_t *)pcVar32)->indent;
      if ((iVar18 == 0) || (((fb_output_t *)pcVar32)->indent = iVar18 + -1, iVar18 + -1 == 0)) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x6f9,"int gen_json_parser_prototypes(fb_output_t *)");
      }
LAB_00111b74:
      ((fb_output_t *)pcVar32)->indent = iVar18 + -2;
      goto switchD_00111a46_caseD_2;
    }
    println((fb_output_t *)pcVar32,pcVar27,(fb_scoped_name_t *)auStack_740);
switchD_00111a46_caseD_2:
    pfVar24 = pfVar24->link;
  } while (pfVar24 != (fb_symbol_t *)0x0);
LAB_00111b89:
  fb_scope_table_visit
            (&((fb_output_t *)pcVar32)->S->root_schema->scope_index,gen_local_scope_prototype,
             pcVar32);
  println((fb_output_t *)pcVar32,
          "static const char *%s_global_json_parser_enum(flatcc_json_parser_t *ctx, const char *buf, const char *end,"
          ,((fb_output_t *)pcVar32)->S->basename);
  ((fb_output_t *)pcVar32)->indent = ((fb_output_t *)pcVar32)->indent + 2;
  println((fb_output_t *)pcVar32,"int *value_type, uint64_t *value, int *aggregate);");
  iVar18 = ((fb_output_t *)pcVar32)->indent;
  if ((iVar18 == 0) || (((fb_output_t *)pcVar32)->indent = iVar18 + -1, iVar18 + -1 == 0)) {
    __assert_fail("out->indent",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                  ,0x711,"int gen_json_parser_prototypes(fb_output_t *)");
  }
  ((fb_output_t *)pcVar32)->indent = iVar18 + -2;
  println((fb_output_t *)pcVar32,"");
  for (ct_00 = (fb_compound_type_t *)((fb_output_t *)pcVar32)->S->symbols;
      ct_00 != (fb_compound_type_t *)0x0; ct_00 = (fb_compound_type_t *)(ct_00->symbol).link) {
    switch((ct_00->symbol).kind) {
    case 0:
      uStack_810 = 0;
      uStack_808._0_4_ = 0;
      uStack_808._4_4_ = 0;
      pgStack_820 = (gen_unmatched_f *)0x0;
      pfStack_818 = (fb_compound_type_t *)0x0;
      auStack_830 = (undefined1  [8])0x0;
      pgStack_828 = (gen_match_f *)0x0;
      if ((ct_00->symbol).kind != 0) {
LAB_0011334e:
        __assert_fail("ct->symbol.kind == fb_is_table",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x5a3,"int gen_table_parser(fb_output_t *, fb_compound_type_t *)");
      }
      auStack_830 = (undefined1  [8])build_compound_dict(ct_00,(int *)&uStack_848);
      uVar12 = uStack_848;
      if (0 < (int)uStack_848 && auStack_830 == (undefined1  [8])0x0) {
        __flatcc_fb_gen_c_json_parser_cold_1();
        goto LAB_001133cf;
      }
      uVar13 = (ulong)uStack_848;
      pgStack_828 = gen_field_match;
      pgStack_820 = gen_field_unmatched;
      if ((int)uStack_848 < 1) {
        uVar19 = 0;
      }
      else {
        lVar31 = 0;
        uVar19 = 0;
        do {
          uVar19 = (uVar19 + 1) -
                   (uint)(*(int *)((long)&((dict_entry_t *)auStack_830)->hint + lVar31) == 0);
          lVar31 = lVar31 + 0x20;
        } while (uVar13 << 5 != lVar31);
      }
      uStack_810 = (ulong)uVar19 << 0x20;
      pfStack_818 = ct_00;
      memset((fb_scoped_name_t *)auStack_740,0,0xe8);
      __flatcc_fb_scoped_symbol_name(ct_00->scope,&ct_00->symbol,(fb_scoped_name_t *)auStack_740);
      println((fb_output_t *)pcVar32,
              "static const char *%s_parse_json_table(flatcc_json_parser_t *ctx, const char *buf, const char *end, flatcc_builder_ref_t *result)"
              ,(fb_scoped_name_t *)auStack_740);
      println((fb_output_t *)pcVar32,"{");
      ((fb_output_t *)pcVar32)->indent = ((fb_output_t *)pcVar32)->indent + 1;
      println((fb_output_t *)pcVar32,"int more;");
      if (0 < (int)uVar12) {
        println((fb_output_t *)pcVar32,"void *pval;");
        println((fb_output_t *)pcVar32,"flatcc_builder_ref_t ref, *pref;");
        println((fb_output_t *)pcVar32,"const char *mark;");
        println((fb_output_t *)pcVar32,"uint64_t w;");
      }
      if (uStack_810._4_4_ != 0) {
        println((fb_output_t *)pcVar32,"size_t h_unions;");
      }
      println((fb_output_t *)pcVar32,"");
      println((fb_output_t *)pcVar32,"*result = 0;");
      println((fb_output_t *)pcVar32,"if (flatcc_builder_start_table(ctx->ctx, %lu)) goto failed;",
              ct_00->count);
      if (uStack_810._4_4_ != 0) {
        println((fb_output_t *)pcVar32,
                "if (end == flatcc_json_parser_prepare_unions(ctx, buf, end, %lu, &h_unions)) goto failed;"
               );
      }
      println((fb_output_t *)pcVar32,"buf = flatcc_json_parser_object_start(ctx, buf, end, &more);")
      ;
      println((fb_output_t *)pcVar32,"while (more) {");
      ((fb_output_t *)pcVar32)->indent = ((fb_output_t *)pcVar32)->indent + 1;
      println((fb_output_t *)pcVar32,"buf = flatcc_json_parser_symbol_start(ctx, buf, end);");
      if ((int)uVar12 < 1) {
        println((fb_output_t *)pcVar32,"/* Table has no fields. */");
        println((fb_output_t *)pcVar32,"buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);");
      }
      else {
        println((fb_output_t *)pcVar32,"w = flatcc_json_parser_symbol_part(buf, end);");
        gen_trie((fb_output_t *)pcVar32,(trie_t *)auStack_830,0,uVar12 - 1,0);
      }
      println((fb_output_t *)pcVar32,"buf = flatcc_json_parser_object_end(ctx, buf, end, &more);");
      if (((fb_output_t *)pcVar32)->indent == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x5d3,"int gen_table_parser(fb_output_t *, fb_compound_type_t *)");
      }
      ((fb_output_t *)pcVar32)->indent = ((fb_output_t *)pcVar32)->indent + -1;
      println((fb_output_t *)pcVar32,"}");
      println((fb_output_t *)pcVar32,"if (ctx->error) goto failed;");
      if (0 < (int)uVar12) {
        bVar34 = true;
        lVar31 = 0;
        do {
          lVar7 = *(long *)((long)((long)auStack_830 + 0x10) + lVar31);
          if ((*(ushort *)(lVar7 + 0x70) & 4) == 0) {
            if ((ushort)((short)*(undefined4 *)(lVar7 + 0x28) - 0xfU) < 2) {
              lVar23 = -(ulong)(*(short *)(*(long *)(lVar7 + 0x18) + 0x10) == 4);
            }
            else {
              lVar23 = 0;
            }
            if ((*(ushort *)(lVar7 + 0x70) >> 8 & 1) != 0) {
              lVar23 = lVar23 + *(long *)(lVar7 + 0x88);
              if (bVar34) {
                bVar34 = false;
                println((fb_output_t *)pcVar32,
                        "if (!flatcc_builder_check_required_field(ctx->ctx, %lu)",lVar23);
                ((fb_output_t *)pcVar32)->indent = ((fb_output_t *)pcVar32)->indent + 1;
              }
              else {
                bVar34 = false;
                println((fb_output_t *)pcVar32,
                        "||  !flatcc_builder_check_required_field(ctx->ctx, %lu)",lVar23);
              }
            }
          }
          lVar31 = lVar31 + 0x20;
        } while (uVar13 << 5 != lVar31);
        if (!bVar34) {
          if (((fb_output_t *)pcVar32)->indent == 0) {
            __assert_fail("out->indent",
                          "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                          ,0x5e7,"int gen_table_parser(fb_output_t *, fb_compound_type_t *)");
          }
          ((fb_output_t *)pcVar32)->indent = ((fb_output_t *)pcVar32)->indent + -1;
          println((fb_output_t *)pcVar32,") {");
          ((fb_output_t *)pcVar32)->indent = ((fb_output_t *)pcVar32)->indent + 1;
          println((fb_output_t *)pcVar32,
                  "buf = flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_required);"
                 );
          println((fb_output_t *)pcVar32,"goto failed;");
          if (((fb_output_t *)pcVar32)->indent == 0) {
            __assert_fail("out->indent",
                          "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                          ,0x5ea,"int gen_table_parser(fb_output_t *, fb_compound_type_t *)");
          }
          ((fb_output_t *)pcVar32)->indent = ((fb_output_t *)pcVar32)->indent + -1;
          println((fb_output_t *)pcVar32,"}");
        }
      }
      if (uStack_810._4_4_ != 0) {
        println((fb_output_t *)pcVar32,
                "buf = flatcc_json_parser_finalize_unions(ctx, buf, end, h_unions);");
      }
      println((fb_output_t *)pcVar32,
              "if (!(*result = flatcc_builder_end_table(ctx->ctx))) goto failed;");
      println((fb_output_t *)pcVar32,"return buf;");
      ((fb_output_t *)pcVar32)->tmp_indent = ((fb_output_t *)pcVar32)->indent;
      ((fb_output_t *)pcVar32)->indent = 0;
      println((fb_output_t *)pcVar32,"failed:");
      ((fb_output_t *)pcVar32)->indent = ((fb_output_t *)pcVar32)->tmp_indent;
      println((fb_output_t *)pcVar32,
              "return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_runtime);"
             );
      if (((fb_output_t *)pcVar32)->indent == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x5f6,"int gen_table_parser(fb_output_t *, fb_compound_type_t *)");
      }
      ((fb_output_t *)pcVar32)->indent = ((fb_output_t *)pcVar32)->indent + -1;
      println((fb_output_t *)pcVar32,"}");
      println((fb_output_t *)pcVar32,"");
      println((fb_output_t *)pcVar32,
              "static inline int %s_parse_json_as_root(flatcc_builder_t *B, flatcc_json_parser_t *ctx, const char *buf, size_t bufsiz, flatcc_json_parser_flags_t flags, const char *fid)"
              ,auStack_740);
      println((fb_output_t *)pcVar32,"{");
      ((fb_output_t *)pcVar32)->indent = ((fb_output_t *)pcVar32)->indent + 1;
      println((fb_output_t *)pcVar32,
              "return flatcc_json_parser_table_as_root(B, ctx, buf, bufsiz, flags, fid, %s_parse_json_table);"
              ,auStack_740);
      if (((fb_output_t *)pcVar32)->indent == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x5fc,"int gen_table_parser(fb_output_t *, fb_compound_type_t *)");
      }
      ((fb_output_t *)pcVar32)->indent = ((fb_output_t *)pcVar32)->indent + -1;
      println((fb_output_t *)pcVar32,"}");
      println((fb_output_t *)pcVar32,"");
      if (auStack_830 != (undefined1  [8])0x0) {
        free((void *)auStack_830);
      }
      break;
    case 1:
      uStack_810 = 0;
      uStack_808._0_4_ = 0;
      uStack_808._4_4_ = 0;
      pgStack_820 = (gen_unmatched_f *)0x0;
      pfStack_818 = (fb_compound_type_t *)0x0;
      auStack_830 = (undefined1  [8])0x0;
      pgStack_828 = (gen_match_f *)0x0;
      if ((ct_00->symbol).kind != 1) {
        __assert_fail("ct->symbol.kind == fb_is_struct",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x54a,"int gen_struct_parser_inline(fb_output_t *, fb_compound_type_t *)");
      }
      auStack_830 = (undefined1  [8])build_compound_dict(ct_00,(int *)&uStack_848);
      uVar12 = uStack_848;
      if (0 < (int)uStack_848 && auStack_830 == (undefined1  [8])0x0) {
        __flatcc_fb_gen_c_json_parser_cold_2();
        goto LAB_0011334e;
      }
      uStack_810 = CONCAT44(uStack_810._4_4_,1);
      pgStack_828 = gen_field_match;
      pgStack_820 = gen_field_unmatched;
      pfStack_818 = ct_00;
      memset((fb_scoped_name_t *)auStack_740,0,0xe8);
      __flatcc_fb_scoped_symbol_name(ct_00->scope,&ct_00->symbol,(fb_scoped_name_t *)auStack_740);
      println((fb_output_t *)pcVar32,
              "static const char *%s_parse_json_struct_inline(flatcc_json_parser_t *ctx, const char *buf, const char *end, void *struct_base)"
              ,(fb_scoped_name_t *)auStack_740);
      println((fb_output_t *)pcVar32,"{");
      ((fb_output_t *)pcVar32)->indent = ((fb_output_t *)pcVar32)->indent + 1;
      println((fb_output_t *)pcVar32,"int more;");
      if (0 < (int)uVar12) {
        println((fb_output_t *)pcVar32,"flatcc_builder_ref_t ref;");
        println((fb_output_t *)pcVar32,"void *pval;");
        println((fb_output_t *)pcVar32,"const char *mark;");
        println((fb_output_t *)pcVar32,"uint64_t w;");
      }
      println((fb_output_t *)pcVar32,"");
      println((fb_output_t *)pcVar32,"buf = flatcc_json_parser_object_start(ctx, buf, end, &more);")
      ;
      println((fb_output_t *)pcVar32,"while (more) {");
      ((fb_output_t *)pcVar32)->indent = ((fb_output_t *)pcVar32)->indent + 1;
      if (uVar12 == 0) {
        println((fb_output_t *)pcVar32,"/* Empty struct. */");
        println((fb_output_t *)pcVar32,"buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);");
      }
      else {
        println((fb_output_t *)pcVar32,"buf = flatcc_json_parser_symbol_start(ctx, buf, end);");
        println((fb_output_t *)pcVar32,"w = flatcc_json_parser_symbol_part(buf, end);");
        gen_trie((fb_output_t *)pcVar32,(trie_t *)auStack_830,0,uVar12 - 1,0);
      }
      println((fb_output_t *)pcVar32,"buf = flatcc_json_parser_object_end(ctx, buf, end , &more);");
      if (((fb_output_t *)pcVar32)->indent == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x56b,"int gen_struct_parser_inline(fb_output_t *, fb_compound_type_t *)");
      }
      ((fb_output_t *)pcVar32)->indent = ((fb_output_t *)pcVar32)->indent + -1;
      println((fb_output_t *)pcVar32,"}");
      println((fb_output_t *)pcVar32,"return buf;");
      if (0 < (int)uVar12) {
        ((fb_output_t *)pcVar32)->tmp_indent = ((fb_output_t *)pcVar32)->indent;
        ((fb_output_t *)pcVar32)->indent = 0;
        println((fb_output_t *)pcVar32,"failed:");
        ((fb_output_t *)pcVar32)->indent = ((fb_output_t *)pcVar32)->tmp_indent;
        println((fb_output_t *)pcVar32,
                "return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_runtime);"
               );
      }
      if (((fb_output_t *)pcVar32)->indent == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x574,"int gen_struct_parser_inline(fb_output_t *, fb_compound_type_t *)");
      }
      ((fb_output_t *)pcVar32)->indent = ((fb_output_t *)pcVar32)->indent + -1;
      println((fb_output_t *)pcVar32,"}");
      println((fb_output_t *)pcVar32,"");
      if (auStack_830 != (undefined1  [8])0x0) {
        free((void *)auStack_830);
      }
      if ((ct_00->symbol).kind != 1) {
        __assert_fail("ct->symbol.kind == fb_is_struct",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x57e,"int gen_struct_parser(fb_output_t *, fb_compound_type_t *)");
      }
      memset((fb_scoped_name_t *)auStack_740,0,0xe8);
      __flatcc_fb_scoped_symbol_name(ct_00->scope,&ct_00->symbol,(fb_scoped_name_t *)auStack_740);
      println((fb_output_t *)pcVar32,
              "static const char *%s_parse_json_struct(flatcc_json_parser_t *ctx, const char *buf, const char *end, flatcc_builder_ref_t *result)"
              ,(fb_scoped_name_t *)auStack_740);
      println((fb_output_t *)pcVar32,"{");
      ((fb_output_t *)pcVar32)->indent = ((fb_output_t *)pcVar32)->indent + 1;
      println((fb_output_t *)pcVar32,"void *pval;");
      println((fb_output_t *)pcVar32,"");
      println((fb_output_t *)pcVar32,"*result = 0;");
      println((fb_output_t *)pcVar32,
              "if (!(pval = flatcc_builder_start_struct(ctx->ctx, %lu, %u))) goto failed;",
              ct_00->size,(ulong)ct_00->align);
      println((fb_output_t *)pcVar32,"buf = %s_parse_json_struct_inline(ctx, buf, end, pval);",
              (fb_scoped_name_t *)auStack_740);
      println((fb_output_t *)pcVar32,
              "if (ctx->error || !(*result = flatcc_builder_end_struct(ctx->ctx))) goto failed;");
      println((fb_output_t *)pcVar32,"return buf;");
      ((fb_output_t *)pcVar32)->tmp_indent = ((fb_output_t *)pcVar32)->indent;
      ((fb_output_t *)pcVar32)->indent = 0;
      println((fb_output_t *)pcVar32,"failed:");
      ((fb_output_t *)pcVar32)->indent = ((fb_output_t *)pcVar32)->tmp_indent;
      println((fb_output_t *)pcVar32,
              "return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_runtime);"
             );
      if (((fb_output_t *)pcVar32)->indent == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x58f,"int gen_struct_parser(fb_output_t *, fb_compound_type_t *)");
      }
      ((fb_output_t *)pcVar32)->indent = ((fb_output_t *)pcVar32)->indent + -1;
      println((fb_output_t *)pcVar32,"}");
      println((fb_output_t *)pcVar32,"");
      println((fb_output_t *)pcVar32,
              "static inline int %s_parse_json_as_root(flatcc_builder_t *B, flatcc_json_parser_t *ctx, const char *buf, size_t bufsiz, flatcc_json_parser_flags_t flags, const char *fid)"
              ,(fb_scoped_name_t *)auStack_740);
      println((fb_output_t *)pcVar32,"{");
      ((fb_output_t *)pcVar32)->indent = ((fb_output_t *)pcVar32)->indent + 1;
      println((fb_output_t *)pcVar32,
              "return flatcc_json_parser_struct_as_root(B, ctx, buf, bufsiz, flags, fid, %s_parse_json_struct);"
              ,(fb_scoped_name_t *)auStack_740);
      if (((fb_output_t *)pcVar32)->indent == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x595,"int gen_struct_parser(fb_output_t *, fb_compound_type_t *)");
      }
      ((fb_output_t *)pcVar32)->indent = ((fb_output_t *)pcVar32)->indent + -1;
      println((fb_output_t *)pcVar32,"}");
      println((fb_output_t *)pcVar32,"");
      break;
    case 3:
      gen_enum_parser((fb_output_t *)pcVar32,ct_00);
      break;
    case 4:
      memset((fb_scoped_name_t *)auStack_740,0,0xe8);
      memset(auStack_830,0,0xe8);
      __flatcc_fb_scoped_symbol_name(ct_00->scope,&ct_00->symbol,(fb_scoped_name_t *)auStack_740);
      println((fb_output_t *)pcVar32,
              "static const char *%s_parse_json_union(flatcc_json_parser_t *ctx, const char *buf, const char *end, uint8_t type, flatcc_builder_ref_t *result)"
              ,(fb_scoped_name_t *)auStack_740);
      println((fb_output_t *)pcVar32,"{");
      ((fb_output_t *)pcVar32)->indent = ((fb_output_t *)pcVar32)->indent + 1;
      println((fb_output_t *)pcVar32,"");
      println((fb_output_t *)pcVar32,"*result = 0;");
      println((fb_output_t *)pcVar32,"switch (type) {");
      println((fb_output_t *)pcVar32,"case 0: /* NONE */");
      ((fb_output_t *)pcVar32)->indent = ((fb_output_t *)pcVar32)->indent + 1;
      println((fb_output_t *)pcVar32,"return flatcc_json_parser_none(ctx, buf, end);");
      if (((fb_output_t *)pcVar32)->indent == 0) {
LAB_001133cf:
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x614,"int gen_union_parser(fb_output_t *, fb_compound_type_t *)");
      }
      ((fb_output_t *)pcVar32)->indent = ((fb_output_t *)pcVar32)->indent + -1;
      for (pfVar24 = ct_00->members; pfVar24 != (fb_symbol_t *)0x0; pfVar24 = pfVar24->link) {
        uVar3 = pfVar24[1].kind;
        if (uVar3 != 0) {
          uVar12 = (uint)pfVar24->ident->len;
          if (uVar3 == 0xb) {
            println((fb_output_t *)pcVar32,"case %u: /* %.*s */",(ulong)*(uint *)&pfVar24[3].link,
                    (ulong)uVar12);
            ((fb_output_t *)pcVar32)->indent = ((fb_output_t *)pcVar32)->indent + 1;
            println((fb_output_t *)pcVar32,
                    "buf = flatcc_json_parser_build_string(ctx, buf, end, result);");
            println((fb_output_t *)pcVar32,"break;");
            iVar18 = ((fb_output_t *)pcVar32)->indent;
            if (iVar18 == 0) {
              __assert_fail("out->indent",
                            "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                            ,0x631,"int gen_union_parser(fb_output_t *, fb_compound_type_t *)");
            }
          }
          else {
            if (uVar3 != 0xf) {
              __flatcc_fb_gen_c_json_parser_cold_4();
LAB_001132a9:
              __assert_fail("out->indent",
                            "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                            ,0x62b,"int gen_union_parser(fb_output_t *, fb_compound_type_t *)");
            }
            __flatcc_fb_scoped_symbol_name
                      ((fb_scope_t *)pfVar24[1].link[1].link,pfVar24[1].link,
                       (fb_scoped_name_t *)auStack_830);
            println((fb_output_t *)pcVar32,"case %u: /* %.*s */",(ulong)*(uint *)&pfVar24[3].link,
                    (ulong)uVar12);
            ((fb_output_t *)pcVar32)->indent = ((fb_output_t *)pcVar32)->indent + 1;
            uVar3 = (pfVar24[1].link)->kind;
            pcVar27 = "buf = %s_parse_json_table(ctx, buf, end, result);";
            if (uVar3 != 0) {
              if (uVar3 != 1) {
                __flatcc_fb_gen_c_json_parser_cold_3();
                goto LAB_001132ec;
              }
              pcVar27 = "buf = %s_parse_json_struct(ctx, buf, end, result);";
            }
            println((fb_output_t *)pcVar32,pcVar27,auStack_830);
            println((fb_output_t *)pcVar32,"break;");
            iVar18 = ((fb_output_t *)pcVar32)->indent;
            if (iVar18 == 0) goto LAB_001132a9;
          }
          ((fb_output_t *)pcVar32)->indent = iVar18 + -1;
        }
      }
      println((fb_output_t *)pcVar32,"default:");
      ((fb_output_t *)pcVar32)->indent = ((fb_output_t *)pcVar32)->indent + 1;
      println((fb_output_t *)pcVar32,"if (!(ctx->flags & flatcc_json_parser_f_skip_unknown)) {");
      ((fb_output_t *)pcVar32)->indent = ((fb_output_t *)pcVar32)->indent + 1;
      println((fb_output_t *)pcVar32,
              "return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_unknown_union);"
             );
      if (((fb_output_t *)pcVar32)->indent == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x63c,"int gen_union_parser(fb_output_t *, fb_compound_type_t *)");
      }
      ((fb_output_t *)pcVar32)->indent = ((fb_output_t *)pcVar32)->indent + -1;
      println((fb_output_t *)pcVar32,"} else {");
      ((fb_output_t *)pcVar32)->indent = ((fb_output_t *)pcVar32)->indent + 1;
      println((fb_output_t *)pcVar32,"return flatcc_json_parser_generic_json(ctx, buf, end);");
      if (((fb_output_t *)pcVar32)->indent == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x63e,"int gen_union_parser(fb_output_t *, fb_compound_type_t *)");
      }
      ((fb_output_t *)pcVar32)->indent = ((fb_output_t *)pcVar32)->indent + -1;
      println((fb_output_t *)pcVar32,"}");
      if (((fb_output_t *)pcVar32)->indent == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x63f,"int gen_union_parser(fb_output_t *, fb_compound_type_t *)");
      }
      ((fb_output_t *)pcVar32)->indent = ((fb_output_t *)pcVar32)->indent + -1;
      println((fb_output_t *)pcVar32,"}");
      println((fb_output_t *)pcVar32,"if (ctx->error) return buf;");
      println((fb_output_t *)pcVar32,"if (!*result) {");
      ((fb_output_t *)pcVar32)->indent = ((fb_output_t *)pcVar32)->indent + 1;
      println((fb_output_t *)pcVar32,
              "return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_runtime);"
             );
      if (((fb_output_t *)pcVar32)->indent == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x643,"int gen_union_parser(fb_output_t *, fb_compound_type_t *)");
      }
      ((fb_output_t *)pcVar32)->indent = ((fb_output_t *)pcVar32)->indent + -1;
      println((fb_output_t *)pcVar32,"}");
      println((fb_output_t *)pcVar32,"return buf;");
      if (((fb_output_t *)pcVar32)->indent == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x645,"int gen_union_parser(fb_output_t *, fb_compound_type_t *)");
      }
      ((fb_output_t *)pcVar32)->indent = ((fb_output_t *)pcVar32)->indent + -1;
      println((fb_output_t *)pcVar32,"}");
      println((fb_output_t *)pcVar32,"");
      memset((fb_scoped_name_t *)auStack_740,0,0xe8);
      __flatcc_fb_scoped_symbol_name(ct_00->scope,&ct_00->symbol,(fb_scoped_name_t *)auStack_740);
      println((fb_output_t *)pcVar32,"static int %s_json_union_accept_type(uint8_t type)",
              (fb_scoped_name_t *)auStack_740);
      println((fb_output_t *)pcVar32,"{");
      ((fb_output_t *)pcVar32)->indent = ((fb_output_t *)pcVar32)->indent + 1;
      println((fb_output_t *)pcVar32,"switch (type) {");
      for (pfVar24 = ct_00->members; pfVar24 != (fb_symbol_t *)0x0; pfVar24 = pfVar24->link) {
        if (pfVar24[1].kind == 0) {
          println((fb_output_t *)pcVar32,"case 0: return 1; /* NONE */");
        }
        else {
          println((fb_output_t *)pcVar32,"case %u: return 1; /* %.*s */",
                  (ulong)*(uint *)&pfVar24[3].link,(ulong)(uint)pfVar24->ident->len);
        }
      }
      println((fb_output_t *)pcVar32,"default: return 0;");
      iVar18 = ((fb_output_t *)pcVar32)->indent;
      iVar20 = iVar18 + 1;
      ((fb_output_t *)pcVar32)->indent = iVar20;
      if (iVar20 == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x663,"int gen_union_accept_type(fb_output_t *, fb_compound_type_t *)");
      }
      ((fb_output_t *)pcVar32)->indent = iVar18;
      println((fb_output_t *)pcVar32,"}");
      if (((fb_output_t *)pcVar32)->indent == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x664,"int gen_union_accept_type(fb_output_t *, fb_compound_type_t *)");
      }
      ((fb_output_t *)pcVar32)->indent = ((fb_output_t *)pcVar32)->indent + -1;
      println((fb_output_t *)pcVar32,"}");
      println((fb_output_t *)pcVar32,"");
      gen_enum_parser((fb_output_t *)pcVar32,ct_00);
    }
  }
  fb_scope_table_visit
            (&((fb_output_t *)pcVar32)->S->root_schema->scope_index,gen_local_scope_parser,pcVar32);
  auStack_830 = (undefined1  [8])0x0;
  pgStack_828 = (gen_match_f *)0x0;
  pgStack_820 = (gen_unmatched_f *)0x0;
  pfStack_818 = (fb_compound_type_t *)0x0;
  uStack_810._0_4_ = 0;
  uStack_810._4_4_ = 0;
  uStack_808._0_4_ = 0;
  uStack_808._4_4_ = 0;
  pfStack_6e8 = ((fb_output_t *)pcVar32)->S;
  pfStack_840 = pfStack_6e8->root_schema;
  auStack_740._8_4_ = 0;
  auStack_740._12_4_ = 0;
  pcStack_6f0 = (char *)0x0;
  peStack_700 = (enum_entry_t *)0x0;
  psStack_6f8 = (service_entry_t *)0x0;
  pcStack_710 = (char *)0x0;
  poStack_708 = (object_entry_t *)0x0;
  peStack_720 = (enum_entry_t *)0x0;
  psStack_718 = (service_entry_t *)0x0;
  auStack_740._16_8_ = 0;
  poStack_728 = (object_entry_t *)0x0;
  auStack_740._0_4_ = 1;
  auStack_740._4_4_ = 0;
  fb_scope_table_visit(&pfStack_840->scope_index,count_symbols,auStack_740);
  sVar29 = (size_t)(int)auStack_740._4_4_;
  peVar14 = (entry_t *)calloc(sVar29,0x10);
  uVar10 = auStack_740._8_4_;
  poStack_728 = peVar14;
  peVar15 = (entry_t *)calloc((long)(int)auStack_740._8_4_,0x10);
  iStack_844 = auStack_740._12_4_;
  peStack_720 = peVar15;
  peVar16 = (entry_t *)calloc((long)(int)auStack_740._12_4_,0x10);
  sStack_838 = auStack_740._16_8_;
  psStack_718 = peVar16;
  pcStack_710 = (char *)malloc(auStack_740._16_8_);
  poStack_708 = peVar14;
  peStack_700 = peVar15;
  psStack_6f8 = peVar16;
  pcStack_6f0 = pcStack_710;
  if (((((long)sVar29 < 1 || peVar14 != (entry_t *)0x0) &&
       ((int)uVar10 < 1 || peVar15 != (entry_t *)0x0)) &&
      (iStack_844 < 1 || peVar16 != (entry_t *)0x0)) &&
     (sStack_838 == 0 || pcStack_710 != (char *)0x0)) {
    fb_scope_table_visit(&pfStack_840->scope_index,install_symbols,auStack_740);
    sort_entries(poStack_728,auStack_740._4_4_);
    sort_entries(peStack_720,auStack_740._8_4_);
    sort_entries(psStack_718,auStack_740._12_4_);
    iVar18 = auStack_740._8_4_;
    sVar29 = (size_t)(int)auStack_740._8_4_;
    if ((sVar29 == 0) ||
       (__base = (dict_entry_t *)malloc(sVar29 << 5), peVar11 = peStack_720,
       __base == (dict_entry_t *)0x0)) {
      __base = (dict_entry_t *)0x0;
    }
    else {
      lVar31 = 8;
      sVar25 = sVar29;
      do {
        pcVar27 = *(char **)((long)&peVar11->ct + lVar31);
        *(char **)((long)__base + lVar31 * 2 + -0x10) = pcVar27;
        sVar17 = strlen(pcVar27);
        *(int *)((long)__base + lVar31 * 2 + -8) = (int)sVar17;
        *(undefined8 *)((long)&__base->text + lVar31 * 2) =
             *(undefined8 *)((long)peVar11 + lVar31 + -8);
        *(undefined4 *)((long)&__base->len + lVar31 * 2) = 0;
        lVar31 = lVar31 + 0x10;
        sVar25 = sVar25 - 1;
      } while (sVar25 != 0);
      qsort(__base,sVar29,0x20,dict_cmp);
      iVar18 = auStack_740._8_4_;
    }
    auStack_830 = (undefined1  [8])__base;
    if (0 < iVar18 && __base == (dict_entry_t *)0x0) {
      __flatcc_fb_gen_c_json_parser_cold_5();
LAB_001136a5:
      __assert_fail("out->indent",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                    ,0x4ef,"int gen_global_scope_parser(fb_output_t *)");
    }
    pfStack_818 = (fb_compound_type_t *)0x0;
    uStack_810._0_4_ = 4;
    pgStack_828 = gen_scope_match;
    pgStack_820 = gen_scope_unmatched;
    println((fb_output_t *)pcVar32,
            "static const char *%s_global_json_parser_enum(flatcc_json_parser_t *ctx, const char *buf, const char *end,"
            ,((fb_output_t *)pcVar32)->S->basename);
    ((fb_output_t *)pcVar32)->indent = ((fb_output_t *)pcVar32)->indent + 2;
    println((fb_output_t *)pcVar32,"int *value_type, uint64_t *value, int *aggregate)");
    iVar20 = ((fb_output_t *)pcVar32)->indent;
    if ((iVar20 == 0) || (((fb_output_t *)pcVar32)->indent = iVar20 + -1, iVar20 + -1 == 0)) {
      __assert_fail("out->indent",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                    ,0x4ea,"int gen_global_scope_parser(fb_output_t *)");
    }
    ((fb_output_t *)pcVar32)->indent = iVar20 + -2;
    println((fb_output_t *)pcVar32,"{");
    ((fb_output_t *)pcVar32)->indent = ((fb_output_t *)pcVar32)->indent + 1;
    if (iVar18 == 0) {
      println((fb_output_t *)pcVar32,"/* Global scope has no enum / union types to look up. */");
      println((fb_output_t *)pcVar32,"return buf; /* unmatched; */");
      iVar18 = ((fb_output_t *)pcVar32)->indent;
      if (iVar18 == 0) goto LAB_001136a5;
    }
    else {
      println((fb_output_t *)pcVar32,"const char *unmatched = buf;");
      println((fb_output_t *)pcVar32,"const char *mark;");
      println((fb_output_t *)pcVar32,"uint64_t w;");
      println((fb_output_t *)pcVar32,"");
      println((fb_output_t *)pcVar32,"w = flatcc_json_parser_symbol_part(buf, end);");
      gen_trie((fb_output_t *)pcVar32,(trie_t *)auStack_830,0,iVar18 + -1,0);
      println((fb_output_t *)pcVar32,"return buf;");
      iVar18 = ((fb_output_t *)pcVar32)->indent;
      if (iVar18 == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x4f8,"int gen_global_scope_parser(fb_output_t *)");
      }
    }
    ((fb_output_t *)pcVar32)->indent = iVar18 + -1;
    println((fb_output_t *)pcVar32,"}");
    println((fb_output_t *)pcVar32,"");
    if (auStack_830 != (undefined1  [8])0x0) {
      free((void *)auStack_830);
    }
  }
  clear_catalog((catalog_t *)auStack_740);
  pfVar24 = (((fb_output_t *)pcVar32)->S->root_type).type;
  if (pfVar24 != (fb_symbol_t *)0x0) {
    if (pfVar24->kind == 1) {
      memset((fb_scoped_name_t *)auStack_740,0,0xe8);
      __flatcc_fb_scoped_symbol_name
                ((fb_scope_t *)pfVar24[1].link,pfVar24,(fb_scoped_name_t *)auStack_740);
      println((fb_output_t *)pcVar32,
              "static int %s_parse_json(flatcc_builder_t *B, flatcc_json_parser_t *ctx,",
              ((fb_output_t *)pcVar32)->S->basename);
      ((fb_output_t *)pcVar32)->indent = ((fb_output_t *)pcVar32)->indent + 2;
      println((fb_output_t *)pcVar32,"const char *buf, size_t bufsiz, int flags)");
      iVar18 = ((fb_output_t *)pcVar32)->indent;
      if ((iVar18 == 0) || (((fb_output_t *)pcVar32)->indent = iVar18 + -1, iVar18 + -1 == 0)) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x6a2,"int gen_root_struct_parser(fb_output_t *, fb_compound_type_t *)");
      }
      ((fb_output_t *)pcVar32)->indent = iVar18 + -2;
      println((fb_output_t *)pcVar32,"{");
      ((fb_output_t *)pcVar32)->indent = ((fb_output_t *)pcVar32)->indent + 1;
      println((fb_output_t *)pcVar32,"flatcc_json_parser_t ctx_;");
      println((fb_output_t *)pcVar32,"flatcc_builder_ref_t root;");
      println((fb_output_t *)pcVar32,"");
      println((fb_output_t *)pcVar32,"ctx = ctx ? ctx : &ctx_;");
      println((fb_output_t *)pcVar32,"flatcc_json_parser_init(ctx, B, buf, buf + bufsiz, flags);");
      pfVar8 = ((fb_output_t *)pcVar32)->S;
      if ((pfVar8->file_identifier).type == 3) {
        println((fb_output_t *)pcVar32,
                "if (flatcc_builder_start_buffer(B, \"%.*s\", 0, 0)) return -1;",
                (ulong)(uint)(pfVar8->file_identifier).field_0.s.len,
                (pfVar8->file_identifier).field_0.s.s);
      }
      else {
        println((fb_output_t *)pcVar32,"if (flatcc_builder_start_buffer(B, 0, 0, 0)) return -1;");
      }
      println((fb_output_t *)pcVar32,"buf = %s_parse_json_struct(ctx, buf, buf + bufsiz, &root);",
              auStack_740);
      println((fb_output_t *)pcVar32,"if (ctx->error) {");
      ((fb_output_t *)pcVar32)->indent = ((fb_output_t *)pcVar32)->indent + 1;
      println((fb_output_t *)pcVar32,"return ctx->error;");
      if (((fb_output_t *)pcVar32)->indent == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x6b2,"int gen_root_struct_parser(fb_output_t *, fb_compound_type_t *)");
      }
      ((fb_output_t *)pcVar32)->indent = ((fb_output_t *)pcVar32)->indent + -1;
      println((fb_output_t *)pcVar32,"}");
      println((fb_output_t *)pcVar32,"if (!flatcc_builder_end_buffer(B, root)) return -1;");
      println((fb_output_t *)pcVar32,"ctx->end_loc = buf;");
      println((fb_output_t *)pcVar32,"return 0;");
      iVar18 = ((fb_output_t *)pcVar32)->indent;
      if (iVar18 == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x6b6,"int gen_root_struct_parser(fb_output_t *, fb_compound_type_t *)");
      }
    }
    else {
      if (pfVar24->kind != 0) goto LAB_00113244;
      memset((fb_scoped_name_t *)auStack_740,0,0xe8);
      __flatcc_fb_scoped_symbol_name
                ((fb_scope_t *)pfVar24[1].link,pfVar24,(fb_scoped_name_t *)auStack_740);
      println((fb_output_t *)pcVar32,
              "static int %s_parse_json(flatcc_builder_t *B, flatcc_json_parser_t *ctx,",
              ((fb_output_t *)pcVar32)->S->basename);
      ((fb_output_t *)pcVar32)->indent = ((fb_output_t *)pcVar32)->indent + 2;
      println((fb_output_t *)pcVar32,
              "const char *buf, size_t bufsiz, flatcc_json_parser_flags_t flags)");
      iVar18 = ((fb_output_t *)pcVar32)->indent;
      if ((iVar18 == 0) || (((fb_output_t *)pcVar32)->indent = iVar18 + -1, iVar18 + -1 == 0)) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x67f,"int gen_root_table_parser(fb_output_t *, fb_compound_type_t *)");
      }
      ((fb_output_t *)pcVar32)->indent = iVar18 + -2;
      println((fb_output_t *)pcVar32,"{");
      ((fb_output_t *)pcVar32)->indent = ((fb_output_t *)pcVar32)->indent + 1;
      println((fb_output_t *)pcVar32,"flatcc_json_parser_t parser;");
      println((fb_output_t *)pcVar32,"flatcc_builder_ref_t root;");
      println((fb_output_t *)pcVar32,"");
      println((fb_output_t *)pcVar32,"ctx = ctx ? ctx : &parser;");
      println((fb_output_t *)pcVar32,"flatcc_json_parser_init(ctx, B, buf, buf + bufsiz, flags);");
      pfVar8 = ((fb_output_t *)pcVar32)->S;
      if ((pfVar8->file_identifier).type == 3) {
        println((fb_output_t *)pcVar32,
                "if (flatcc_builder_start_buffer(B, \"%.*s\", 0, 0)) return -1;",
                (ulong)(uint)(pfVar8->file_identifier).field_0.s.len,
                (pfVar8->file_identifier).field_0.s.s);
      }
      else {
        println((fb_output_t *)pcVar32,"if (flatcc_builder_start_buffer(B, 0, 0, 0)) return -1;");
      }
      println((fb_output_t *)pcVar32,"%s_parse_json_table(ctx, buf, buf + bufsiz, &root);",
              auStack_740);
      println((fb_output_t *)pcVar32,"if (ctx->error) {");
      ((fb_output_t *)pcVar32)->indent = ((fb_output_t *)pcVar32)->indent + 1;
      println((fb_output_t *)pcVar32,"return ctx->error;");
      if (((fb_output_t *)pcVar32)->indent == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x68f,"int gen_root_table_parser(fb_output_t *, fb_compound_type_t *)");
      }
      ((fb_output_t *)pcVar32)->indent = ((fb_output_t *)pcVar32)->indent + -1;
      println((fb_output_t *)pcVar32,"}");
      println((fb_output_t *)pcVar32,"if (!flatcc_builder_end_buffer(B, root)) return -1;");
      println((fb_output_t *)pcVar32,"ctx->end_loc = buf;");
      println((fb_output_t *)pcVar32,"return 0;");
      iVar18 = ((fb_output_t *)pcVar32)->indent;
      if (iVar18 == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x693,"int gen_root_table_parser(fb_output_t *, fb_compound_type_t *)");
      }
    }
    ((fb_output_t *)pcVar32)->indent = iVar18 + -1;
    println((fb_output_t *)pcVar32,"}");
    println((fb_output_t *)pcVar32,"");
  }
LAB_00113244:
  if (((fb_output_t *)pcVar32)->opts->cgen_pragmas != 0) {
    fwrite("#include \"flatcc/flatcc_epilogue.h\"\n",0x24,1,(FILE *)((fb_output_t *)pcVar32)->fp);
  }
  println((fb_output_t *)pcVar32,"#endif /* %s_JSON_PARSER_H */",
          ((fb_output_t *)pcVar32)->S->basenameup);
  return 0;
}

Assistant:

static int gen_union_fields(fb_output_t *out, const char *st, int n, const char *s,
        fb_compound_type_t *ct, int is_vector)
{
    const char *nsc = out->nsc;
    fb_symbol_t *sym;
    fb_member_t *member;
    const char *su;
    int nu;
    fb_scoped_name_t snref;
    fb_scoped_name_t snu;
    const char *kind = is_vector ? "vector_value" : "value";

    fb_clear(snref);
    fb_clear(snu);
    fb_compound_name(ct, &snref);
    for (sym = ct->members; sym; sym = sym->link) {
        member = (fb_member_t *)sym;
        symbol_name(sym, &nu, &su);
        switch (member->type.type) {
        case vt_missing:
            break;
        case vt_compound_type_ref:
            fb_compound_name(member->type.ct, &snu);
            switch (member->type.ct->symbol.kind) {
            case fb_is_table:
                fprintf(out->fp,
                        "__%sbuild_union_table_%s_field(%s, %s_%.*s, %s, %.*s, %s)\n",
                        nsc, kind, nsc, st, n, s, snref.text, nu, su, snu.text);
                break;
            case fb_is_struct:
                fprintf(out->fp,
                        "__%sbuild_union_struct_%s_field(%s, %s_%.*s, %s, %.*s, %s)\n",
                        nsc, kind, nsc, st, n, s, snref.text, nu, su, snu.text);
                break;
            default:
                gen_panic(out, "internal error: unexpected union member compound type");
                return -1;
            }
            break;
        case vt_string_type:
            fprintf(out->fp,
                    "__%sbuild_union_string_%s_field(%s, %s_%.*s, %s, %.*s)\n",
                    nsc, kind, nsc, st, n, s, snref.text, nu, su);
            break;
        default:
            gen_panic(out, "internal error: unexpected union member type");
            return -1;
        }
    }
    return 0;
}